

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void nukedopn2_reset_chip(void *chip)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  uint mute;
  
  uVar1 = *chip;
  mute = 0;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    mute = mute | *(int *)((long)chip + lVar3 * 4 + 0x4fc) << ((byte)lVar3 & 0x1f);
  }
  uVar2 = *(undefined8 *)((long)chip + 0x4f4);
  NOPN2_Reset((ym3438_t *)chip,*(Bit32u *)((long)chip + 8),*(Bit32u *)((long)chip + 0xc));
  *(undefined8 *)chip = uVar1;
  nukedopn2_set_mute_mask(chip,mute);
  *(undefined8 *)((long)chip + 0x4f4) = uVar2;
  return;
}

Assistant:

void nukedopn2_reset_chip(void *chip)
{
    ym3438_t* opn2 = (ym3438_t*)chip;
    Bit32u i;
    DEV_DATA devData;
    UINT32 mute;
    Bit32u type;
    Bit32u filter;
    
    devData = opn2->_devData;
    mute = 0;
    for (i = 0; i < 7; i++)
        mute |= (opn2->mute[i] << i);
    type = opn2->chip_type;
    filter = opn2->use_filter;
    
    NOPN2_Reset(opn2, opn2->clock, opn2->smplRate);
    
    opn2->_devData = devData;
    nukedopn2_set_mute_mask(opn2, mute);
    opn2->chip_type = type;
    opn2->use_filter = filter;
}